

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

VkResult __thiscall
VmaDeviceMemoryBlock::CheckCorruption(VmaDeviceMemoryBlock *this,VmaAllocator hAllocator)

{
  VkResult VVar1;
  void *pData;
  void *local_20;
  
  local_20 = (void *)0x0;
  VVar1 = Map(this,hAllocator,1,&local_20);
  if (VVar1 == VK_SUCCESS) {
    VVar1 = (*this->m_pMetadata->_vptr_VmaBlockMetadata[0x12])(this->m_pMetadata,local_20);
    Unmap(this,hAllocator,1);
  }
  return VVar1;
}

Assistant:

VkResult VmaDeviceMemoryBlock::CheckCorruption(VmaAllocator hAllocator)
{
    void* pData = nullptr;
    VkResult res = Map(hAllocator, 1, &pData);
    if (res != VK_SUCCESS)
    {
        return res;
    }

    res = m_pMetadata->CheckCorruption(pData);

    Unmap(hAllocator, 1);

    return res;
}